

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpose.hpp
# Opt level: O0

void qclab::dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<double>>>
               (Op op,SquareMatrix<std::complex<double>_> *A)

{
  int64_t iVar1;
  int64_t iVar2;
  complex<double> *pcVar3;
  complex<double> *__b;
  undefined8 extraout_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 uVar4;
  long local_58;
  int64_t i_1;
  int64_t j_1;
  long local_38;
  int64_t i;
  int64_t j;
  int64_t cols;
  int64_t rows;
  SquareMatrix<std::complex<double>_> *A_local;
  Op op_local;
  
  if (op != NoTrans) {
    iVar1 = SquareMatrix<std::complex<double>_>::rows(A);
    iVar2 = SquareMatrix<std::complex<double>_>::cols(A);
    if (op == ConjTrans) {
      for (i = 0; i < iVar2; i = i + 1) {
        for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
          pcVar3 = SquareMatrix<std::complex<double>_>::operator()(A,local_38,i);
          std::conj<double>(pcVar3);
          uVar4 = in_XMM1_Qa;
          pcVar3 = SquareMatrix<std::complex<double>_>::operator()(A,local_38,i);
          *(undefined8 *)pcVar3->_M_value = extraout_XMM0_Qa;
          *(undefined8 *)(pcVar3->_M_value + 8) = in_XMM1_Qa;
          in_XMM1_Qa = uVar4;
        }
      }
    }
    for (i_1 = 0; local_58 = i_1, i_1 < iVar2 + -1; i_1 = i_1 + 1) {
      while (local_58 = local_58 + 1, local_58 < iVar1) {
        pcVar3 = SquareMatrix<std::complex<double>_>::operator()(A,local_58,i_1);
        __b = SquareMatrix<std::complex<double>_>::operator()(A,i_1,local_58);
        std::swap<std::complex<double>>(pcVar3,__b);
      }
    }
  }
  return;
}

Assistant:

void operateInPlace( Op op , T& A ) {
      if ( op == Op::NoTrans ) return ;
      const int64_t rows = A.rows() ;
      const int64_t cols = A.cols() ;
      if constexpr ( qclab::is_complex_v< typename T::value_type > ) {
        if ( op == Op::ConjTrans ) {
          // conjugate
          #pragma omp parallel for
          for ( int64_t j = 0; j < cols; j++ ) {
            for ( int64_t i = 0; i < rows; i++ ) {
              A(i,j) = std::conj( A(i,j) ) ;
            }
          }
        }
      }
      // transpose
      #pragma omp parallel for
      for ( int64_t j = 0; j < cols - 1; j++ ) {
        for ( int64_t i = j + 1; i < rows; i++ ) {
          std::swap( A(i,j) , A(j,i) ) ;
        }
      }
    }